

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3a0a69::CoalesceProvider::provideStreamData
          (CoalesceProvider *this,QPDFObjGen *param_1,Pipeline *p)

{
  undefined1 local_98 [8];
  string all_description;
  QPDFObjGen local_68;
  string local_60;
  undefined1 local_40 [8];
  string description;
  Pipeline *p_local;
  QPDFObjGen *param_1_local;
  CoalesceProvider *this_local;
  
  description.field_2._8_8_ = p;
  QTC::TC("qpdf","QPDFObjectHandle coalesce provide stream data",0);
  local_68 = QPDFObjectHandle::getObjGen(&this->containing_page);
  QPDFObjGen::unparse_abi_cxx11_(&local_60,&local_68,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "page object ",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)local_98);
  QPDFObjectHandle::pipeContentStreams
            (&this->old_contents,(Pipeline *)description.field_2._8_8_,(string *)local_40,
             (string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
CoalesceProvider::provideStreamData(QPDFObjGen const&, Pipeline* p)
{
    QTC::TC("qpdf", "QPDFObjectHandle coalesce provide stream data");
    std::string description = "page object " + containing_page.getObjGen().unparse(' ');
    std::string all_description;
    old_contents.pipeContentStreams(p, description, all_description);
}